

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_153ab3::IntegerCastExpr::printLeft(IntegerCastExpr *this,OutputStream *S)

{
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  IntegerCastExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"(");
  OutputStream::operator+=(local_18,local_28);
  Node::print(this->Ty,local_18);
  StringView::StringView(&local_38,")");
  OutputStream::operator+=(local_18,local_38);
  OutputStream::operator+=(local_18,this->Integer);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Ty->print(S);
    S += ")";
    S += Integer;
  }